

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O3

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateEncoderBody(SwiftGenerator *this,StructDef *struct_def)

{
  CodeWriter *this_00;
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  BaseType BVar4;
  FieldDef *field;
  EnumDef *pEVar5;
  int iVar6;
  mapped_type *pmVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  StructDef *pSVar9;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  pointer ppFVar12;
  SwiftGenerator *pSVar13;
  bool bVar14;
  bool bVar15;
  key_type local_230;
  SwiftGenerator *local_210;
  string local_208;
  BaseType local_1e4;
  StructDef *local_1e0;
  IdlNamer *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1e0 = struct_def;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"var container = encoder.container(keyedBy: CodingKeys.self)","");
  this_00 = &this->code_;
  local_210 = this;
  CodeWriter::operator+=(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppFVar12 = (local_1e0->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar12 !=
      (local_1e0->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_1d8 = &local_210->namer_;
    pSVar9 = local_1e0;
    do {
      paVar8 = &local_230.field_2;
      field = *ppFVar12;
      if (field->deprecated == false) {
        BVar4 = (field->value).type.base_type;
        local_1e4 = (field->value).type.element;
        if ((BVar4 == BASE_TYPE_ARRAY) || (BVar4 == BASE_TYPE_VECTOR)) {
          bVar14 = local_1e4 != BASE_TYPE_UTYPE;
        }
        else {
          bVar14 = false;
        }
        paVar2 = &local_208.field_2;
        pEVar5 = (field->value).type.enum_def;
        local_230._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"FIELDVAR","");
        (*(local_1d8->super_Namer)._vptr_Namer[7])(&local_208,local_1d8,field);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_230);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar8) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        local_230._M_dataplus._M_p = (pointer)paVar8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CONSTANT","");
        SwiftConstant_abi_cxx11_(&local_208,local_210,field);
        pmVar7 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this_00->value_map_,&local_230);
        std::__cxx11::string::_M_assign((string *)pmVar7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._M_dataplus._M_p != paVar2) {
          operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != paVar8) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        if (bVar14) {
          paVar8 = &local_70.field_2;
          local_70._M_dataplus._M_p = (pointer)paVar8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_70,"if {{FIELDVAR}}Count > 0 {","");
          CodeWriter::operator+=(this_00,&local_70);
          bVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_70._M_dataplus._M_p == paVar8;
          _Var11._M_p = local_70._M_dataplus._M_p;
LAB_002dff59:
          if (!bVar15) {
LAB_002dff60:
            operator_delete(_Var11._M_p,paVar8->_M_allocated_capacity + 1);
          }
LAB_002dff6b:
          piVar1 = &(local_210->code_).cur_ident_lvl_;
          *piVar1 = *piVar1 + 1;
          bVar15 = true;
        }
        else {
          if (BVar4 - BASE_TYPE_UTYPE < 10 && pEVar5 != (EnumDef *)0x0) {
            if (field->presence != kOptional) {
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CONSTANT","");
              GenEnumDefaultValue_abi_cxx11_(&local_208,local_210,field);
              pmVar7 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&this_00->value_map_,&local_230);
              std::__cxx11::string::_M_assign((string *)pmVar7);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_208._M_dataplus._M_p != paVar2) {
                operator_delete(local_208._M_dataplus._M_p,
                                local_208.field_2._M_allocated_capacity + 1);
              }
              paVar8 = &local_90.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p,
                                local_230.field_2._M_allocated_capacity + 1);
              }
              local_90._M_dataplus._M_p = (pointer)paVar8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_90,"if {{FIELDVAR}} != {{CONSTANT}} {","");
              CodeWriter::operator+=(this_00,&local_90);
              _Var11._M_p = local_90._M_dataplus._M_p;
LAB_002e006b:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var11._M_p != paVar8) goto LAB_002dff60;
              goto LAB_002dff6b;
            }
          }
          else {
            if (BVar4 - BASE_TYPE_FLOAT < 2) {
              psVar3 = &(field->value).constant;
              iVar6 = std::__cxx11::string::compare((char *)psVar3);
              if (((iVar6 == 0) ||
                  (iVar6 = std::__cxx11::string::compare((char *)psVar3), iVar6 == 0)) ||
                 (iVar6 = std::__cxx11::string::compare((char *)psVar3), iVar6 == 0)) {
                paVar8 = &local_b0.field_2;
                local_b0._M_dataplus._M_p = (pointer)paVar8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_b0,"if !{{FIELDVAR}}.isNaN {","");
                CodeWriter::operator+=(this_00,&local_b0);
                bVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_b0._M_dataplus._M_p == paVar8;
                _Var11._M_p = local_b0._M_dataplus._M_p;
                goto LAB_002dff59;
              }
            }
            if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
              if (BVar4 == BASE_TYPE_BOOL) {
                if (field->presence != kOptional) {
                  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_230,"CONSTANT","");
                  SwiftConstant_abi_cxx11_(&local_208,local_210,field);
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](&this_00->value_map_,&local_230);
                  std::__cxx11::string::_M_assign((string *)pmVar7);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_208._M_dataplus._M_p != &local_208.field_2) {
                    operator_delete(local_208._M_dataplus._M_p,
                                    local_208.field_2._M_allocated_capacity + 1);
                  }
                  paVar8 = &local_f0.field_2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_230._M_dataplus._M_p != &local_230.field_2) {
                    operator_delete(local_230._M_dataplus._M_p,
                                    local_230.field_2._M_allocated_capacity + 1);
                  }
                  local_f0._M_dataplus._M_p = (pointer)paVar8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f0,"if {{FIELDVAR}} != {{CONSTANT}} {","");
                  CodeWriter::operator+=(this_00,&local_f0);
                  _Var11._M_p = local_f0._M_dataplus._M_p;
                  goto LAB_002e006b;
                }
              }
              else if (field->presence != kOptional) {
                paVar8 = &local_d0.field_2;
                local_d0._M_dataplus._M_p = (pointer)paVar8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_d0,"if {{FIELDVAR}} != {{CONSTANT}} {","");
                CodeWriter::operator+=(this_00,&local_d0);
                bVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_d0._M_dataplus._M_p == paVar8;
                _Var11._M_p = local_d0._M_dataplus._M_p;
                goto LAB_002dff59;
              }
            }
          }
          bVar15 = false;
        }
        pSVar13 = local_210;
        if (((pEVar5 == (EnumDef *)0x0) || (0xfffffff5 < BVar4 - BASE_TYPE_FLOAT)) ||
           (pEVar5->is_union == false)) {
          if ((bVar14) &&
             ((0xb < local_1e4 - BASE_TYPE_UTYPE ||
              (local_1e4 - BASE_TYPE_UTYPE < 10 && pEVar5 != (EnumDef *)0x0)))) {
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_110,
                       "var contentEncoder = container.nestedUnkeyedContainer(forKey: .{{FIELDVAR}})"
                       ,"");
            CodeWriter::operator+=(this_00,&local_110);
            pSVar13 = local_210;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1
                             );
            }
            local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_130,"for index in 0..<{{FIELDVAR}}Count {","");
            CodeWriter::operator+=(this_00,&local_130);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_130._M_dataplus._M_p != &local_130.field_2) {
              operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1
                             );
            }
            piVar1 = &(pSVar13->code_).cur_ident_lvl_;
            *piVar1 = *piVar1 + 1;
            local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_150,
                       "guard let type = {{FIELDVAR}}(at: index) else { continue }","");
            CodeWriter::operator+=(this_00,&local_150);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_dataplus._M_p != &local_150.field_2) {
              operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1
                             );
            }
            local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_170,"try contentEncoder.encode(type)","");
            CodeWriter::operator+=(this_00,&local_170);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1
                             );
            }
            iVar6 = (pSVar13->code_).cur_ident_lvl_;
            if (iVar6 != 0) {
              (pSVar13->code_).cur_ident_lvl_ = iVar6 + -1;
            }
            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"}","");
            CodeWriter::operator+=(this_00,&local_190);
            uVar10 = local_190.field_2._M_allocated_capacity;
            _Var11._M_p = local_190._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
LAB_002e0465:
              operator_delete(_Var11._M_p,uVar10 + 1);
            }
          }
          else {
            local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1b0,
                       "try container.encodeIfPresent({{FIELDVAR}}, forKey: .{{FIELDVAR}})","");
            CodeWriter::operator+=(this_00,&local_1b0);
            uVar10 = local_1b0.field_2._M_allocated_capacity;
            _Var11._M_p = local_1b0._M_dataplus._M_p;
            pSVar13 = local_210;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) goto LAB_002e0465;
          }
        }
        else {
          GenerateEncoderUnionBody(local_210,field);
        }
        pSVar9 = local_1e0;
        if ((bVar15) && (iVar6 = (pSVar13->code_).cur_ident_lvl_, iVar6 != 0)) {
          (pSVar13->code_).cur_ident_lvl_ = iVar6 + -1;
        }
        if ((bVar14) || ((BVar4 - BASE_TYPE_UTYPE < 0xc && (field->presence != kOptional)))) {
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"}","");
          CodeWriter::operator+=(this_00,&local_1d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      ppFVar12 = ppFVar12 + 1;
    } while (ppFVar12 !=
             (pSVar9->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenerateEncoderBody(const StructDef &struct_def) {
    code_ += "var container = encoder.container(keyedBy: CodingKeys.self)";
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto type = field.value.type;

      const auto is_non_union_vector =
          (field.value.type.base_type == BASE_TYPE_ARRAY ||
           field.value.type.base_type == BASE_TYPE_VECTOR) &&
          field.value.type.VectorType().base_type != BASE_TYPE_UTYPE;

      code_.SetValue("FIELDVAR", namer_.Variable(field));
      code_.SetValue("CONSTANT", SwiftConstant(field));
      bool should_indent = true;
      if (is_non_union_vector) {
        code_ += "if {{FIELDVAR}}Count > 0 {";
      } else if (IsEnum(type) && !field.IsOptional()) {
        code_.SetValue("CONSTANT", GenEnumDefaultValue(field));
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else if (IsFloat(type.base_type) &&
                 StringIsFlatbufferNan(field.value.constant)) {
        code_ += "if !{{FIELDVAR}}.isNaN {";
      } else if (IsScalar(type.base_type) && !IsEnum(type) &&
                 !IsBool(type.base_type) && !field.IsOptional()) {
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else if (IsBool(type.base_type) && !field.IsOptional()) {
        code_.SetValue("CONSTANT", SwiftConstant(field));
        code_ += "if {{FIELDVAR}} != {{CONSTANT}} {";
      } else {
        should_indent = false;
      }
      if (should_indent) Indent();

      if (IsUnion(type) && !IsEnum(type)) {
        GenerateEncoderUnionBody(field);
      } else if (is_non_union_vector &&
                 (!IsScalar(type.VectorType().base_type) ||
                  IsEnum(type.VectorType()))) {
        code_ +=
            "var contentEncoder = container.nestedUnkeyedContainer(forKey: "
            ".{{FIELDVAR}})";
        code_ += "for index in 0..<{{FIELDVAR}}Count {";
        Indent();
        code_ += "guard let type = {{FIELDVAR}}(at: index) else { continue }";
        code_ += "try contentEncoder.encode(type)";
        Outdent();
        code_ += "}";
      } else {
        code_ +=
            "try container.encodeIfPresent({{FIELDVAR}}, forKey: "
            ".{{FIELDVAR}})";
      }
      if (should_indent) Outdent();

      if (is_non_union_vector ||
          (IsScalar(type.base_type) && !field.IsOptional())) {
        code_ += "}";
      }
    }
  }